

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall amrex::MLMG::prepareForNSolve(MLMG *this)

{
  MLLinOp *pMVar1;
  DistributionMapping *__args_1;
  int *__args_2;
  MultiFab *pMVar2;
  MLMG *pMVar3;
  MultiFab *pMVar4;
  undefined8 uVar5;
  int iVar6;
  MultiFab *local_68;
  int ncomp;
  undefined1 local_5c [4];
  undefined1 local_58 [40];
  
  (*this->linop->_vptr_MLLinOp[0x21])(local_58,this->linop,(ulong)(uint)this->nsolve_grid_size);
  uVar5 = local_58._0_8_;
  local_58._0_8_ = (_func_int **)0x0;
  pMVar1 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  (this->ns_linop)._M_t.super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
  super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl = (MLLinOp *)uVar5;
  if ((pMVar1 != (MLLinOp *)0x0) &&
     ((*pMVar1->_vptr_MLLinOp[1])(), (_func_int **)local_58._0_8_ != (_func_int **)0x0)) {
    (**(code **)(*(_func_int **)local_58._0_8_ + 8))();
  }
  ncomp = (*this->linop->_vptr_MLLinOp[5])();
  if (this->cf_strategy == ghostnodes) {
    iVar6 = (*this->linop->_vptr_MLLinOp[6])(this->linop,0,0);
    local_5c = (undefined1  [4])1;
    if (this->cf_strategy == ghostnodes) {
      local_5c = (undefined1  [4])iVar6;
    }
  }
  else {
    iVar6 = 0;
    local_5c = (undefined1  [4])1;
  }
  pMVar1 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  __args_1 = (DistributionMapping *)
             **(undefined8 **)
               &(pMVar1->m_grids).
                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ;
  __args_2 = (int *)**(undefined8 **)
                      &(pMVar1->m_dmap).
                       super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ;
  local_58._0_8_ = (_func_int **)0x1;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58._32_8_ = 0;
  std::
  make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int_const&,int&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>const&>
            ((BoxArray *)&local_68,__args_1,__args_2,&ncomp,(MFInfo *)local_5c,
             (FabFactory<amrex::FArrayBox> *)local_58);
  pMVar4 = local_68;
  local_68 = (MultiFab *)0x0;
  pMVar2 = (this->ns_sol)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->ns_sol)._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar4;
  if ((pMVar2 != (MultiFab *)0x0) &&
     ((**(code **)(*(long *)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))(),
     local_68 != (MultiFab *)0x0)) {
    (**(code **)(*(long *)local_68 + 8))();
  }
  local_68 = (MultiFab *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_58 + 0x10));
  local_5c = (undefined1  [4])0;
  if (this->cf_strategy == ghostnodes) {
    local_5c = (undefined1  [4])iVar6;
  }
  local_58._0_8_ = (pointer)0x1;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58._32_8_ = 0;
  std::
  make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int_const&,int&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>const&>
            ((BoxArray *)&local_68,__args_1,__args_2,&ncomp,(MFInfo *)local_5c,
             (FabFactory<amrex::FArrayBox> *)local_58);
  pMVar4 = local_68;
  local_68 = (MultiFab *)0x0;
  pMVar2 = (this->ns_rhs)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->ns_rhs)._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar4;
  if ((pMVar2 != (MultiFab *)0x0) &&
     ((**(code **)(*(long *)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))(),
     local_68 != (MultiFab *)0x0)) {
    (**(code **)(*(long *)local_68 + 8))();
  }
  local_68 = (MultiFab *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_58 + 0x10));
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&((this->ns_sol)._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
              super_FabArray<amrex::FArrayBox>,0.0);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&((this->ns_rhs)._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
              super_FabArray<amrex::FArrayBox>,0.0);
  pMVar1 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  (*pMVar1->_vptr_MLLinOp[3])
            (pMVar1,0,(this->ns_sol)._M_t.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0,0);
  std::make_unique<amrex::MLMG,amrex::MLLinOp&>((MLLinOp *)local_58);
  uVar5 = local_58._0_8_;
  local_58._0_8_ = (_func_int **)0x0;
  std::__uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::reset
            ((__uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)&this->ns_mlmg,
             (pointer)uVar5);
  std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::~unique_ptr
            ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)local_58);
  pMVar3 = (this->ns_mlmg)._M_t.
           super___uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLMG_*,_std::default_delete<amrex::MLMG>_>.
           super__Head_base<0UL,_amrex::MLMG_*,_false>._M_head_impl;
  pMVar3->verbose = 0;
  pMVar3->do_fixed_number_of_iters = 1;
  pMVar3->max_fmg_iters = 0x14;
  pMVar3->bottom_solver = smoother;
  return;
}

Assistant:

void
MLMG::prepareForNSolve ()
{
    ns_linop = linop.makeNLinOp(nsolve_grid_size);

    const int ncomp = linop.getNComp();
    int nghost = 0;
    if (cf_strategy == CFStrategy::ghostnodes) nghost = linop.getNGrow();

    const BoxArray& ba = (*ns_linop).m_grids[0][0];
    const DistributionMapping& dm =(*ns_linop).m_dmap[0][0];

    int ng = 1;
    if (cf_strategy == CFStrategy::ghostnodes) ng = nghost;
    ns_sol = std::make_unique<MultiFab>(ba, dm, ncomp, ng, MFInfo(), *(ns_linop->Factory(0,0)));
    ng = 0;
    if (cf_strategy == CFStrategy::ghostnodes) ng = nghost;
    ns_rhs = std::make_unique<MultiFab>(ba, dm, ncomp, ng, MFInfo(), *(ns_linop->Factory(0,0)));
    ns_sol->setVal(0.0);
    ns_rhs->setVal(0.0);

    ns_linop->setLevelBC(0, ns_sol.get());

    ns_mlmg = std::make_unique<MLMG>(*ns_linop);
    ns_mlmg->setVerbose(0);
    ns_mlmg->setFixedIter(1);
    ns_mlmg->setMaxFmgIter(20);
    ns_mlmg->setBottomSolver(BottomSolver::smoother);
}